

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.cpp
# Opt level: O3

uint64_t readStringLength(istream *stream)

{
  ulong uVar1;
  uchar c;
  byte local_19;
  
  uVar1 = 0;
  do {
    std::istream::read((char *)stream,(long)&local_19);
    uVar1 = (ulong)(local_19 & 0x7f) | uVar1 << 7;
  } while ((char)local_19 < '\0');
  return uVar1;
}

Assistant:

std::uint64_t readStringLength(std::istream & stream)
{
  std::uint64_t value = 0;
  unsigned char c;
  do {
    stream.read(reinterpret_cast<char *>(&c), 1);
    value <<= 7;
    value |= (c & 0x7F);
  } while (c & 128);
  return value;
}